

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Reader * __thiscall
kj::_::NullableValue<capnp::json::DiscriminatorOptions::Reader>::
emplace<capnp::json::DiscriminatorOptions::Reader>
          (NullableValue<capnp::json::DiscriminatorOptions::Reader> *this,Reader *params)

{
  Reader *params_00;
  Reader *params_local;
  NullableValue<capnp::json::DiscriminatorOptions::Reader> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<capnp::json::DiscriminatorOptions::Reader>(&(this->field_1).value);
  }
  params_00 = fwd<capnp::json::DiscriminatorOptions::Reader>(params);
  ctor<capnp::json::DiscriminatorOptions::Reader,capnp::json::DiscriminatorOptions::Reader>
            (&(this->field_1).value,params_00);
  this->isSet = true;
  return (Reader *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }